

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O3

void __thiscall
TeamChange2IRCCommand::trigger
          (TeamChange2IRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  PlayerInfo *pPVar4;
  size_t sVar5;
  bool bVar6;
  undefined8 uVar7;
  ulong uVar8;
  char *pcVar9;
  undefined8 *puVar10;
  size_type *psVar11;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  
  if (parameters._M_len == 0) {
    pcVar9 = "Error: Too Few Parameters. Syntax: team2 <player>";
    uVar7 = 0x31;
  }
  else {
    lVar2 = Jupiter::IRC::Client::getChannel(source,channel._M_len,channel._M_str);
    if (lVar2 == 0) {
      return;
    }
    Jupiter::IRC::Client::Channel::getType();
    RenX::getCore();
    lVar2 = RenX::Core::getServerCount();
    if (lVar2 != 0) {
      uVar8 = 0;
      bVar6 = false;
      do {
        uVar3 = RenX::getCore();
        pPVar4 = (PlayerInfo *)RenX::Core::getServer(uVar3);
        cVar1 = RenX::Server::isLogChanType((int)pPVar4);
        if ((cVar1 != '\0') && (*(long *)((long)&(pPVar4->name).field_2 + 8) != 0)) {
          psVar11 = &(pPVar4->name)._M_string_length;
          for (puVar10 = (undefined8 *)*psVar11; puVar10 != psVar11;
              puVar10 = (undefined8 *)*puVar10) {
            in_string._M_str = (char *)puVar10[3];
            in_string._M_len = puVar10[4];
            sVar5 = jessilib::find<char,char,false>(in_string,parameters);
            if (sVar5 != 0xffffffffffffffff) {
              cVar1 = RenX::Server::changeTeam(pPVar4,(bool)((char)puVar10 + '\x10'));
              bVar6 = true;
              if (cVar1 == '\0') {
                Jupiter::IRC::Client::sendMessage
                          (source,channel._M_len,channel._M_str,0x2d,
                           "Error: Server does not support team changing.");
              }
            }
          }
        }
        uVar8 = (ulong)((int)uVar8 + 1);
        RenX::getCore();
        uVar3 = RenX::Core::getServerCount();
      } while (uVar3 != uVar8);
      if (bVar6) {
        return;
      }
    }
    pcVar9 = "Error: Player not found.";
    uVar7 = 0x18;
  }
  Jupiter::IRC::Client::sendNotice(source,nick._M_len,nick._M_str,uVar7,pcVar9);
  return;
}

Assistant:

void TeamChange2IRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	if (!parameters.empty()) {
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr) {
			int type = chan->getType();
			std::string_view playerName{ parameters };
			bool playerFound = false;
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++) {
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type) && server->players.size() != 0) {
					for (auto node = server->players.begin(); node != server->players.end(); ++node) {
						if (jessilib::findi(node->name, playerName) != std::string::npos) {
							playerFound = true;
							if (server->changeTeam(*node, false) == false) {
								source->sendMessage(channel, "Error: Server does not support team changing."sv);
							}
						}
					}
				}
			}
			if (playerFound == false)
				source->sendNotice(nick, "Error: Player not found."sv);
		}
	}
	else source->sendNotice(nick, "Error: Too Few Parameters. Syntax: team2 <player>"sv);
}